

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O3

bool bssl::spake2plus::Register
               (Span<unsigned_char> out_w0,Span<unsigned_char> out_w1,
               Span<unsigned_char> out_registration_record,Span<const_unsigned_char> password,
               Span<const_unsigned_char> id_prover,Span<const_unsigned_char> id_verifier)

{
  bool bVar1;
  int iVar2;
  uint8_t *password_00;
  size_t sVar3;
  EC_GROUP *group;
  ulong uVar4;
  size_t sVar5;
  Span<unsigned_char> out_buf;
  Span<unsigned_char> out_buf_00;
  Span<const_unsigned_char> bytes;
  Span<const_unsigned_char> bytes_00;
  Span<const_unsigned_char> bytes_01;
  ScopedCBB mhf_input;
  uint8_t key [80];
  BN_ULONG w1_words [5];
  BN_ULONG w0_words [5];
  EC_AFFINE L;
  EC_SCALAR w1;
  EC_SCALAR w0;
  EC_JACOBIAN L_j;
  
  uVar4 = out_w1.size_ ^ 0x20 | out_w0.size_ ^ 0x20;
  if (out_registration_record.size_ != 0x41 || uVar4 != 0) {
    ERR_put_error(0xe,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                  ,0xb3);
    return false;
  }
  CBB_zero(&mhf_input.ctx_);
  iVar2 = CBB_init(&mhf_input.ctx_,id_verifier.size_ + password.size_ + id_prover.size_ + 0x18);
  if ((((iVar2 == 0) ||
       (bytes.size_ = uVar4, bytes.data_ = (uchar *)password.size_,
       bVar1 = anon_unknown_0::AddLengthPrefixed
                         ((anon_unknown_0 *)&mhf_input,(CBB *)password.data_,bytes), !bVar1)) ||
      (bytes_00.size_ = uVar4, bytes_00.data_ = (uchar *)id_prover.size_,
      bVar1 = anon_unknown_0::AddLengthPrefixed
                        ((anon_unknown_0 *)&mhf_input,(CBB *)id_prover.data_,bytes_00), !bVar1)) ||
     ((bytes_01.size_ = uVar4, bytes_01.data_ = (uchar *)id_verifier.size_,
      bVar1 = anon_unknown_0::AddLengthPrefixed
                        ((anon_unknown_0 *)&mhf_input,(CBB *)id_verifier.data_,bytes_01), !bVar1 ||
      (iVar2 = CBB_flush(&mhf_input.ctx_), iVar2 == 0)))) {
    iVar2 = 0xc1;
  }
  else {
    password_00 = CBB_data(&mhf_input.ctx_);
    sVar3 = CBB_len(&mhf_input.ctx_);
    sVar5 = 0x8000;
    iVar2 = EVP_PBE_scrypt((char *)password_00,sVar3,(uint8_t *)0x0,0,0x8000,8,1,0x2100000,key,0x50)
    ;
    if (iVar2 == 0) {
      iVar2 = 0xe0;
    }
    else {
      group = EC_group_p256();
      bn_big_endian_to_words(w0_words,5,key,0x28);
      ec_scalar_reduce(group,&w0,w0_words,5);
      out_buf.size_ = sVar5;
      out_buf.data_ = (uchar *)0x20;
      anon_unknown_0::ScalarToSizedBuffer
                ((anon_unknown_0 *)group,(EC_GROUP *)&w0,(EC_SCALAR *)out_w0.data_,out_buf);
      bn_big_endian_to_words(w1_words,5,key + 0x28,0x28);
      ec_scalar_reduce(group,&w1,w1_words,5);
      out_buf_00.size_ = sVar5;
      out_buf_00.data_ = (uchar *)0x20;
      anon_unknown_0::ScalarToSizedBuffer
                ((anon_unknown_0 *)group,(EC_GROUP *)&w1,(EC_SCALAR *)out_w1.data_,out_buf_00);
      iVar2 = ec_point_mul_scalar_base(group,&L_j,&w1);
      if ((iVar2 != 0) && (iVar2 = ec_jacobian_to_affine(group,&L,&L_j), iVar2 != 0)) {
        sVar3 = ec_point_to_bytes(group,&L,POINT_CONVERSION_UNCOMPRESSED,
                                  out_registration_record.data_,0x41);
        bVar1 = true;
        if (sVar3 != 0) goto LAB_0029a024;
      }
      iVar2 = 0xfa;
    }
  }
  bVar1 = false;
  ERR_put_error(0xe,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                ,iVar2);
LAB_0029a024:
  CBB_cleanup(&mhf_input.ctx_);
  return bVar1;
}

Assistant:

bool Register(Span<uint8_t> out_w0, Span<uint8_t> out_w1,
              Span<uint8_t> out_registration_record,
              Span<const uint8_t> password, Span<const uint8_t> id_prover,
              Span<const uint8_t> id_verifier) {
  if (out_w0.size() != kVerifierSize || out_w1.size() != kVerifierSize ||
      out_registration_record.size() != kRegistrationRecordSize) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // Offline registration format from:
  // https://www.rfc-editor.org/rfc/rfc9383.html#section-3.2
  ScopedCBB mhf_input;
  if (!CBB_init(mhf_input.get(), password.size() + id_prover.size() +
                                     id_verifier.size() +
                                     3 * sizeof(uint64_t)) ||  //
      !AddLengthPrefixed(mhf_input.get(), password) ||
      !AddLengthPrefixed(mhf_input.get(), id_prover) ||
      !AddLengthPrefixed(mhf_input.get(), id_verifier) ||
      !CBB_flush(mhf_input.get())) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // https://neuromancer.sk/std/nist/P-256
  //   sage: p =
  //   0xffffffff00000001000000000000000000000000ffffffffffffffffffffffff
  //   ....: K = GF(p)
  //   ....: a =
  //   K(0xffffffff00000001000000000000000000000000fffffffffffffffffffffffc)
  //   ....: b =
  //   K(0x5ac635d8aa3a93e7b3ebbd55769886bc651d06b0cc53b0f63bce3c3e27d2604b)
  //   ....: E = EllipticCurve(K, (a, b))
  //   ....: G =
  //   E(0x6b17d1f2e12c4247f8bce6e563a440f277037d812deb33a0f4a13945d898c296,
  //   ....: 0x4fe342e2fe1a7f9b8ee7eb4a7c0f9e162bce33576b315ececbb6406837bf51f5)
  //   ....:
  //   E.set_order(0xffffffff00000000ffffffffffffffffbce6faada7179e84f3b9cac2fc63
  //   ....: 2551 * 0x1)
  //   sage: k = 64
  //   sage: L = (2 * (ceil(log(p)/log(2)) + k)) / 8

  // RFC 9383 Section 3.2
  constexpr size_t kKDFOutputSize = 80;
  constexpr size_t kKDFOutputWords = kKDFOutputSize / BN_BYTES;

  uint8_t key[kKDFOutputSize];
  if (!EVP_PBE_scrypt((const char *)CBB_data(mhf_input.get()),
                      CBB_len(mhf_input.get()), nullptr, 0,
                      /*N=*/32768, /*r=*/8, /*p=*/1,
                      /*max_mem=*/1024 * 1024 * 33, key, kKDFOutputSize)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const EC_GROUP *group = EC_group_p256();
  BN_ULONG w0_words[kKDFOutputWords / 2];
  bn_big_endian_to_words(w0_words, kKDFOutputWords / 2, key,
                         kKDFOutputSize / 2);
  EC_SCALAR w0;
  ec_scalar_reduce(group, &w0, w0_words, kKDFOutputWords / 2);
  ScalarToSizedBuffer(group, &w0, out_w0);

  BN_ULONG w1_words[kKDFOutputWords / 2];
  bn_big_endian_to_words(w1_words, kKDFOutputWords / 2,
                         key + kKDFOutputSize / 2, kKDFOutputSize / 2);
  EC_SCALAR w1;
  ec_scalar_reduce(group, &w1, w1_words, kKDFOutputWords / 2);
  ScalarToSizedBuffer(group, &w1, out_w1);

  EC_JACOBIAN L_j;
  EC_AFFINE L;
  if (!ec_point_mul_scalar_base(group, &L_j, &w1) ||  //
      !ec_jacobian_to_affine(group, &L, &L_j) ||      //
      !ec_point_to_bytes(group, &L, POINT_CONVERSION_UNCOMPRESSED,
                         out_registration_record.data(),
                         kRegistrationRecordSize)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  return true;
}